

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O2

void cmdline_parser_print_help(void)

{
  char cVar1;
  char **ppcVar2;
  
  cVar1 = *gengetopt_args_info_purpose;
  if (*gengetopt_args_info_usage == '\0') {
    if (cVar1 == '\0') goto LAB_00122cce;
LAB_00122cc1:
    puts(gengetopt_args_info_purpose);
  }
  else {
    puts(gengetopt_args_info_usage);
    if (cVar1 != '\0') goto LAB_00122cc1;
  }
  putchar(10);
LAB_00122cce:
  if (*gengetopt_args_info_description != '\0') {
    printf("%s\n\n");
  }
  for (ppcVar2 = gengetopt_args_info_help; *ppcVar2 != (char *)0x0; ppcVar2 = ppcVar2 + 1) {
    puts(*ppcVar2);
  }
  return;
}

Assistant:

static void print_help_common(void)
{
	size_t len_purpose = strlen(gengetopt_args_info_purpose);
	size_t len_usage = strlen(gengetopt_args_info_usage);

	if (len_usage > 0) {
		printf("%s\n", gengetopt_args_info_usage);
	}
	if (len_purpose > 0) {
		printf("%s\n", gengetopt_args_info_purpose);
	}

	if (len_usage || len_purpose) {
		printf("\n");
	}

	if (strlen(gengetopt_args_info_description) > 0) {
		printf("%s\n\n", gengetopt_args_info_description);
	}
}